

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_avx2.c
# Opt level: O2

void lowbd_fwd_txfm2d_64x16_avx2(int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  int8_t *piVar1;
  long lVar2;
  __m256i buf1 [64];
  __m256i buf0 [64];
  longlong local_1060 [256];
  longlong local_860 [262];
  
  piVar1 = av1_fwd_txfm_shift_ls[0x12];
  for (lVar2 = 0; lVar2 != 0x800; lVar2 = lVar2 + 0x200) {
    load_buffer_16bit_to_16bit_avx2(input,stride,(__m256i *)local_860,0x10);
    round_shift_16bit_w16_avx2((__m256i *)local_860,0x10,(int)*piVar1);
    fdct16x16_new_avx2((__m256i *)local_860,(__m256i *)local_860,'\r');
    round_shift_16bit_w16_avx2((__m256i *)local_860,0x10,(int)piVar1[1]);
    transpose_16bit_16x16_avx2((__m256i *)local_860,(__m256i *)((long)local_1060 + lVar2));
    input = input + 0x10;
  }
  fdct16x64_new_avx2((__m256i *)local_1060,(__m256i *)local_1060,'\f');
  round_shift_16bit_w16_avx2((__m256i *)local_1060,0x40,(int)piVar1[2]);
  store_buffer_16bit_to_32bit_w16_avx2((__m256i *)local_1060,output,0x10,0x20);
  memset(output + 0x200,0,0x800);
  return;
}

Assistant:

static void lowbd_fwd_txfm2d_64x16_avx2(const int16_t *input, int32_t *output,
                                        int stride, TX_TYPE tx_type, int bd) {
  (void)bd;
  (void)tx_type;
  assert(tx_type == DCT_DCT);
  const TX_SIZE tx_size = TX_64X16;
  __m256i buf0[64], buf1[64];
  const int8_t *shift = av1_fwd_txfm_shift_ls[tx_size];
  const int txw_idx = get_txw_idx(tx_size);
  const int txh_idx = get_txh_idx(tx_size);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int width = tx_size_wide[tx_size];
  const int height = tx_size_high[tx_size];
  const transform_1d_avx2 col_txfm = fdct16x16_new_avx2;
  const transform_1d_avx2 row_txfm = fdct16x64_new_avx2;
  const int width_div16 = (width >> 4);
  const int height_div16 = (height >> 4);

  for (int i = 0; i < width_div16; i++) {
    load_buffer_16bit_to_16bit_avx2(input + 16 * i, stride, buf0, height);
    round_shift_16bit_w16_avx2(buf0, height, shift[0]);
    col_txfm(buf0, buf0, cos_bit_col);
    round_shift_16bit_w16_avx2(buf0, height, shift[1]);
    for (int j = 0; j < height_div16; ++j) {
      transpose_16bit_16x16_avx2(buf0 + j * 16, buf1 + j * width + 16 * i);
    }
  }

  for (int i = 0; i < height_div16; i++) {
    __m256i *buf = buf1 + width * i;
    row_txfm(buf, buf, cos_bit_row);
    round_shift_16bit_w16_avx2(buf, width, shift[2]);
    store_buffer_16bit_to_32bit_w16_avx2(buf, output + 16 * i, 16, 32);
  }
  // Zero out the bottom 16x32 area.
  memset(output + 16 * 32, 0, 16 * 32 * sizeof(*output));
}